

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O2

char * serialize_put(char *w,SBufExt *sbx,cTValue *o)

{
  long *plVar1;
  uint64_t uVar2;
  undefined8 uVar3;
  ulong uVar4;
  lua_State *L;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint32_t v;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  byte *pbVar13;
  cTValue *pcVar14;
  uint64_t u;
  ulong uVar15;
  uint *puVar16;
  uint local_3c;
  
  uVar15 = o->u64;
  uVar4 = (long)uVar15 >> 0x2f;
  iVar11 = (int)w;
  if (uVar4 == 0xfffffffffffffffb) {
    uVar8 = *(uint *)((uVar15 & 0x7fffffffffff) + 0x14);
    if ((uint)(*(int *)&sbx->e - iVar11) < uVar8 + 5) {
      sbx->w = w;
      w = lj_buf_more2((SBuf *)sbx,uVar8 + 5);
    }
    uVar9 = uVar8 + 0x20;
    if (uVar9 < 0xe0) {
      *w = (char)uVar9;
      pcVar12 = w + 1;
    }
    else {
      pcVar12 = serialize_wu124_(w,uVar9);
    }
    memcpy(pcVar12,(void *)((uVar15 & 0x7fffffffffff) + 0x18),(ulong)uVar8);
    return pcVar12 + uVar8;
  }
  if (uVar4 < 0xfffffffffffffff2) {
    if ((uint)(*(int *)&sbx->e - iVar11) < 9) {
      sbx->w = w;
      w = lj_buf_more2((SBuf *)sbx,9);
    }
    *w = 7;
    *(ulong *)((byte *)w + 1) = uVar15;
    goto LAB_0014ef96;
  }
  if (0xfffffffffffffffc < uVar4) {
    if (*(int *)&sbx->e == iVar11) {
      sbx->w = w;
      w = lj_buf_more2((SBuf *)sbx,1);
      uVar15 = o->u64;
    }
    *w = ~(byte)(uVar15 >> 0x2f);
LAB_0014efd2:
    return (char *)((byte *)w + 1);
  }
  if (uVar4 == 0xfffffffffffffff4) {
    if (sbx->depth < 1) {
      lj_err_caller((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_DEPTH);
    }
    uVar15 = uVar15 & 0x7fffffffffff;
    sbx->depth = sbx->depth + -1;
    uVar4 = (ulong)*(uint *)(uVar15 + 0x30);
    local_3c = 0;
    uVar8 = 2;
    if (uVar4 == 0) {
LAB_0014f16a:
      uVar9 = 0;
    }
    else {
      uVar9 = *(uint *)(uVar15 + 0x30) + 1;
      do {
        if ((long)uVar4 < 1) goto LAB_0014f16a;
        uVar9 = uVar9 - 1;
        lVar7 = uVar4 - 1;
        uVar4 = uVar4 - 1;
      } while ((*(long **)(uVar15 + 0x10))[lVar7] == -1);
      uVar8 = (uint)(**(long **)(uVar15 + 0x10) == -1) * 2 + 2;
    }
    if (*(int *)(uVar15 + 0x34) != 0) {
      local_3c = 0;
      for (lVar7 = 0; (ulong)(*(int *)(uVar15 + 0x34) + 1) * 0x18 - lVar7 != 0; lVar7 = lVar7 + 0x18
          ) {
        local_3c = local_3c + (*(long *)(*(long *)(uVar15 + 0x28) + lVar7) != -1);
      }
    }
    uVar2 = (sbx->dict_mt).gcptr64;
    if ((uVar2 != 0) && (uVar4 = *(ulong *)(uVar15 + 0x20), uVar4 != 0)) {
      uVar10 = (uint)((uVar4 | 0xfffa000000000000) >> 0x20);
      uVar5 = ((uint)uVar4 ^ uVar10) - (uVar10 << 0xe | uVar10 >> 0x12);
      puVar16 = (uint *)((ulong)(((uVar10 << 0x13 | uVar10 >> 0xd) ^ uVar5) -
                                 (uVar5 * 0x2000 | uVar5 >> 0x13) & *(uint *)(uVar2 + 0x34)) * 0x18
                        + *(long *)(uVar2 + 0x28));
      do {
        if (*(ulong *)(puVar16 + 2) == (uVar4 | 0xfffa000000000000)) {
          uVar5 = *puVar16;
          if ((uint)(*(int *)&sbx->e - iVar11) < 6) {
            sbx->w = w;
            w = lj_buf_more2((SBuf *)sbx,6);
          }
          *w = '\x0e';
          if (uVar5 < 0xe0) {
            w[1] = (char)uVar5;
            w = w + 2;
          }
          else {
            w = serialize_wu124_(w + 1,uVar5);
          }
          break;
        }
        puVar16 = *(uint **)(puVar16 + 4);
      } while (puVar16 != (uint *)0x0);
    }
    if ((uint)(*(int *)&sbx->e - (int)w) < 0xb) {
      sbx->w = w;
      w = lj_buf_more2((SBuf *)sbx,0xb);
    }
    uVar5 = uVar8;
    if (uVar9 == 0) {
      uVar5 = 0;
    }
    pbVar13 = (byte *)w + 1;
    *w = (byte)uVar5 | local_3c == 0 ^ 9U;
    if (uVar9 != 0) {
      if (uVar9 < 0xe0) {
        ((byte *)w)[1] = (byte)uVar9;
        pbVar13 = (byte *)w + 2;
      }
      else {
        pbVar13 = (byte *)serialize_wu124_((char *)pbVar13,uVar9);
      }
    }
    if (local_3c != 0) {
      if (local_3c < 0xe0) {
        *pbVar13 = (byte)local_3c;
        pbVar13 = pbVar13 + 1;
      }
      else {
        pbVar13 = (byte *)serialize_wu124_((char *)pbVar13,local_3c);
      }
    }
    if (uVar9 != 0) {
      lVar7 = *(long *)(uVar15 + 0x10);
      for (pcVar14 = (cTValue *)(lVar7 + (ulong)(uVar8 & 0xfffffffc) * 2);
          pcVar14 < (cTValue *)(lVar7 + (ulong)uVar9 * 8); pcVar14 = pcVar14 + 1) {
        pbVar13 = (byte *)serialize_put((char *)pbVar13,sbx,pcVar14);
      }
    }
    if (local_3c == 0) {
LAB_0014f440:
      sbx->depth = sbx->depth + 1;
      return (char *)pbVar13;
    }
    pcVar14 = (cTValue *)((ulong)*(uint *)(uVar15 + 0x34) * 0x18 + *(long *)(uVar15 + 0x28));
    uVar2 = (sbx->dict_str).gcptr64;
    if (uVar2 != 0) {
      do {
        if (pcVar14->u64 != 0xffffffffffffffff) {
          if ((pcVar14[1].u64 & 0xffff800000000000) == 0xfffd800000000000) {
            uVar15 = pcVar14[1].u64 & 0x7fffffffffff;
            puVar16 = (uint *)((ulong)(*(uint *)(uVar2 + 0x34) & *(uint *)(uVar15 + 0xc)) * 0x18 +
                              *(long *)(uVar2 + 0x28));
            do {
              if (((*(ulong *)(puVar16 + 2) & 0xffff800000000000) == 0xfffd800000000000) &&
                 ((*(ulong *)(puVar16 + 2) & 0x7fffffffffff) == uVar15)) {
                uVar8 = *puVar16;
                if ((uint)(*(int *)&sbx->e - (int)pbVar13) < 6) {
                  sbx->w = (char *)pbVar13;
                  pbVar13 = (byte *)lj_buf_more2((SBuf *)sbx,6);
                }
                *pbVar13 = 0xf;
                if (uVar8 < 0xe0) {
                  pbVar13[1] = (byte)uVar8;
                  pbVar13 = pbVar13 + 2;
                }
                else {
                  pbVar13 = (byte *)serialize_wu124_((char *)(pbVar13 + 1),uVar8);
                }
                goto LAB_0014f423;
              }
              puVar16 = *(uint **)(puVar16 + 4);
            } while (puVar16 != (uint *)0x0);
            uVar8 = *(uint *)(uVar15 + 0x14);
            if ((uint)(*(int *)&sbx->e - (int)pbVar13) < uVar8 + 5) {
              sbx->w = (char *)pbVar13;
              pbVar13 = (byte *)lj_buf_more2((SBuf *)sbx,uVar8 + 5);
            }
            v = uVar8 + 0x20;
            if (v < 0xe0) {
              *pbVar13 = (byte)v;
              pbVar13 = pbVar13 + 1;
            }
            else {
              pbVar13 = (byte *)serialize_wu124_((char *)pbVar13,v);
            }
            memcpy(pbVar13,(void *)(uVar15 + 0x18),(ulong)uVar8);
            pbVar13 = pbVar13 + uVar8;
          }
          else {
            pbVar13 = (byte *)serialize_put((char *)pbVar13,sbx,pcVar14 + 1);
          }
LAB_0014f423:
          pbVar13 = (byte *)serialize_put((char *)pbVar13,sbx,pcVar14);
          local_3c = local_3c - 1;
          if (local_3c == 0) goto LAB_0014f440;
        }
        pcVar14 = pcVar14 + -3;
      } while( true );
    }
    do {
      if (pcVar14->u64 != 0xffffffffffffffff) {
        pcVar12 = serialize_put((char *)pbVar13,sbx,pcVar14 + 1);
        pbVar13 = (byte *)serialize_put(pcVar12,sbx,pcVar14);
        local_3c = local_3c - 1;
        if (local_3c == 0) goto LAB_0014f440;
      }
      pcVar14 = pcVar14 + -3;
    } while( true );
  }
  if (uVar4 == 0xfffffffffffffff5) {
    L = (lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8);
    plVar1 = *(long **)((L->glref).ptr64 + 0x180);
    plVar1[2] = (long)L;
    uVar15 = o->it64;
    uVar4 = uVar15 & 0x7fffffffffff;
    lVar7 = *plVar1;
    lVar6 = (ulong)*(ushort *)(uVar4 + 10) * 0x18;
    uVar8 = *(uint *)(lVar7 + lVar6);
    puVar16 = (uint *)(lVar7 + lVar6);
    if ((0x3ffffff < uVar8) || (puVar16[1] != 8)) {
      if (((uVar8 & 0xf4000000) == 0x34000000) && (puVar16[1] == 0x10)) {
        if ((uint)(*(int *)&sbx->e - iVar11) < 0x11) {
          sbx->w = w;
          w = lj_buf_more2((SBuf *)sbx,0x11);
        }
        *w = '\x12';
        uVar3 = *(undefined8 *)(uVar4 + 0x18);
        *(undefined8 *)(w + 1) = *(undefined8 *)(uVar4 + 0x10);
        *(undefined8 *)(w + 9) = uVar3;
        return w + 0x11;
      }
      goto LAB_0014f581;
    }
    if ((uint)(*(int *)&sbx->e - iVar11) < 9) {
      sbx->w = w;
      w = lj_buf_more2((SBuf *)sbx,9);
      uVar8 = *puVar16;
    }
    *w = (uVar8 >> 0x17 & 1) == 0 ^ 0x11;
    *(undefined8 *)((byte *)w + 1) = *(undefined8 *)(uVar4 + 0x10);
  }
  else {
    if (uVar4 != 0xfffffffffffffffc) {
      L = (lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8);
LAB_0014f581:
      uVar4 = 0xd;
      if (0xfffffffffffffff2 < (ulong)((long)uVar15 >> 0x2f)) {
        uVar4 = ~((long)uVar15 >> 0x2f);
      }
      lj_err_callerv(L,LJ_ERR_BUFFER_BADENC,lj_obj_itypename[uVar4]);
    }
    uVar4 = uVar15 & 0x7fffffffff |
            (ulong)*(uint *)(*(long *)(*(long *)(((sbx->L).ptr64 & 0xfffffffffffffff8) + 0x10) +
                                      0x70) + (uVar15 >> 0x27 & 0xff) * 4) << 0x20;
    if ((uint)(*(int *)&sbx->e - iVar11) < 9) {
      sbx->w = w;
      w = lj_buf_more2((SBuf *)sbx,9);
    }
    if (uVar4 == 0) {
      *w = 3;
      goto LAB_0014efd2;
    }
    if (uVar4 >> 0x20 == 0) {
      *w = 4;
      *(int *)((byte *)w + 1) = (int)uVar15;
      return (char *)((byte *)w + 5);
    }
    *w = 5;
    *(ulong *)((byte *)w + 1) = uVar4;
  }
LAB_0014ef96:
  return (char *)((byte *)w + 9);
}

Assistant:

static char *serialize_put(char *w, SBufExt *sbx, cTValue *o)
{
  if (LJ_LIKELY(tvisstr(o))) {
    const GCstr *str = strV(o);
    MSize len = str->len;
    w = serialize_more(w, sbx, 5+len);
    w = serialize_wu124(w, SER_TAG_STR + len);
    w = lj_buf_wmem(w, strdata(str), len);
  } else if (tvisint(o)) {
    uint32_t x = LJ_BE ? lj_bswap((uint32_t)intV(o)) : (uint32_t)intV(o);
    w = serialize_more(w, sbx, 1+4);
    *w++ = SER_TAG_INT; memcpy(w, &x, 4); w += 4;
  } else if (tvisnum(o)) {
    uint64_t x = LJ_BE ? lj_bswap64(o->u64) : o->u64;
    w = serialize_more(w, sbx, 1+sizeof(lua_Number));
    *w++ = SER_TAG_NUM; memcpy(w, &x, 8); w += 8;
  } else if (tvispri(o)) {
    w = serialize_more(w, sbx, 1);
    *w++ = (char)(SER_TAG_NIL + ~itype(o));
  } else if (tvistab(o)) {
    const GCtab *t = tabV(o);
    uint32_t narray = 0, nhash = 0, one = 2;
    if (sbx->depth <= 0) lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_DEPTH);
    sbx->depth--;
    if (t->asize > 0) {  /* Determine max. length of array part. */
      ptrdiff_t i;
      TValue *array = tvref(t->array);
      for (i = (ptrdiff_t)t->asize-1; i >= 0; i--)
	if (!tvisnil(&array[i]))
	  break;
      narray = (uint32_t)(i+1);
      if (narray && tvisnil(&array[0])) one = 4;
    }
    if (t->hmask > 0) {  /* Count number of used hash slots. */
      uint32_t i, hmask = t->hmask;
      Node *node = noderef(t->node);
      for (i = 0; i <= hmask; i++)
	nhash += !tvisnil(&node[i].val);
    }
    /* Write metatable index. */
    if (LJ_UNLIKELY(tabref(sbx->dict_mt)) && tabref(t->metatable)) {
      TValue mto;
      Node *n;
      settabV(sbufL(sbx), &mto, tabref(t->metatable));
      n = hashgcref(tabref(sbx->dict_mt), mto.gcr);
      do {
	if (n->key.u64 == mto.u64) {
	  uint32_t idx = n->val.u32.lo;
	  w = serialize_more(w, sbx, 1+5);
	  *w++ = SER_TAG_DICT_MT;
	  w = serialize_wu124(w, idx);
	  break;
	}
      } while ((n = nextnode(n)));
    }
    /* Write number of array slots and hash slots. */
    w = serialize_more(w, sbx, 1+2*5);
    *w++ = (char)(SER_TAG_TAB + (nhash ? 1 : 0) + (narray ? one : 0));
    if (narray) w = serialize_wu124(w, narray);
    if (nhash) w = serialize_wu124(w, nhash);
    if (narray) {  /* Write array entries. */
      cTValue *oa = tvref(t->array) + (one >> 2);
      cTValue *oe = tvref(t->array) + narray;
      while (oa < oe) w = serialize_put(w, sbx, oa++);
    }
    if (nhash) {  /* Write hash entries. */
      const Node *node = noderef(t->node) + t->hmask;
      GCtab *dict_str = tabref(sbx->dict_str);
      if (LJ_UNLIKELY(dict_str)) {
	for (;; node--)
	  if (!tvisnil(&node->val)) {
	    if (LJ_LIKELY(tvisstr(&node->key))) {
	      /* Inlined lj_tab_getstr is 30% faster. */
	      const GCstr *str = strV(&node->key);
	      Node *n = hashstr(dict_str, str);
	      do {
		if (tvisstr(&n->key) && strV(&n->key) == str) {
		  uint32_t idx = n->val.u32.lo;
		  w = serialize_more(w, sbx, 1+5);
		  *w++ = SER_TAG_DICT_STR;
		  w = serialize_wu124(w, idx);
		  break;
		}
		n = nextnode(n);
		if (!n) {
		  MSize len = str->len;
		  w = serialize_more(w, sbx, 5+len);
		  w = serialize_wu124(w, SER_TAG_STR + len);
		  w = lj_buf_wmem(w, strdata(str), len);
		  break;
		}
	      } while (1);
	    } else {
	      w = serialize_put(w, sbx, &node->key);
	    }
	    w = serialize_put(w, sbx, &node->val);
	    if (--nhash == 0) break;
	  }
      } else {
	for (;; node--)
	  if (!tvisnil(&node->val)) {
	    w = serialize_put(w, sbx, &node->key);
	    w = serialize_put(w, sbx, &node->val);
	    if (--nhash == 0) break;
	  }
      }
    }
    sbx->depth++;
#if LJ_HASFFI
  } else if (tviscdata(o)) {
    CTState *cts = ctype_cts(sbufL(sbx));
    CType *s = ctype_raw(cts, cdataV(o)->ctypeid);
    uint8_t *sp = cdataptr(cdataV(o));
    if (ctype_isinteger(s->info) && s->size == 8) {
      w = serialize_more(w, sbx, 1+8);
      *w++ = (s->info & CTF_UNSIGNED) ? SER_TAG_UINT64 : SER_TAG_INT64;
#if LJ_BE
      { uint64_t u = lj_bswap64(*(uint64_t *)sp); memcpy(w, &u, 8); }
#else
      memcpy(w, sp, 8);
#endif
      w += 8;
    } else if (ctype_iscomplex(s->info) && s->size == 16) {
      w = serialize_more(w, sbx, 1+16);
      *w++ = SER_TAG_COMPLEX;
#if LJ_BE
      {  /* Only swap the doubles. The re/im order stays the same. */
	uint64_t u = lj_bswap64(((uint64_t *)sp)[0]); memcpy(w, &u, 8);
	u = lj_bswap64(((uint64_t *)sp)[1]); memcpy(w+8, &u, 8);
      }
#else
      memcpy(w, sp, 16);
#endif
      w += 16;
    } else {
      goto badenc;  /* NYI other cdata */
    }
#endif
  } else if (tvislightud(o)) {
    uintptr_t ud = (uintptr_t)lightudV(G(sbufL(sbx)), o);
    w = serialize_more(w, sbx, 1+sizeof(ud));
    if (ud == 0) {
      *w++ = SER_TAG_NULL;
    } else if (LJ_32 || checku32(ud)) {
#if LJ_BE && LJ_64
      ud = lj_bswap64(ud);
#elif LJ_BE
      ud = lj_bswap(ud);
#endif
      *w++ = SER_TAG_LIGHTUD32; memcpy(w, &ud, 4); w += 4;
#if LJ_64
    } else {
#if LJ_BE
      ud = lj_bswap64(ud);
#endif
      *w++ = SER_TAG_LIGHTUD64; memcpy(w, &ud, 8); w += 8;
#endif
    }
  } else {
    /* NYI userdata */
#if LJ_HASFFI
  badenc:
#endif
    lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADENC, lj_typename(o));
  }
  return w;
}